

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O0

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::update(COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
         *this)

{
  bool bVar1;
  uint uVar2;
  E_TEXTURE_TYPE EVar3;
  u32 uVar4;
  uint *puVar5;
  ITexture **ppIVar6;
  E_CUBE_SURFACE *pEVar7;
  array<unsigned_int> *this_00;
  GLsizei n;
  long in_RDI;
  double __x;
  u32 bufferCount;
  u32 textureSize_1;
  GLuint textureID_1;
  ECOLOR_FORMAT textureFormat;
  u32 i_1;
  GLenum textarget;
  GLuint textureID;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *currentTexture;
  u32 i;
  u32 textureSize;
  GLenum in_stack_ffffffffffffff6c;
  COpenGLExtensionHandler *in_stack_ffffffffffffff70;
  GLenum textarget_00;
  undefined8 in_stack_ffffffffffffff78;
  GLenum target;
  undefined4 in_stack_ffffffffffffff80;
  ECOLOR_FORMAT in_stack_ffffffffffffff84;
  int local_54;
  GLuint local_4c;
  u32 local_40;
  uint local_3c;
  u32 local_38;
  GLuint local_34;
  ECOLOR_FORMAT local_30;
  uint local_2c;
  int local_28;
  GLuint local_24;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *local_20;
  uint local_18;
  u32 local_14;
  u32 local_10;
  uint local_c;
  
  if (((*(byte *)(in_RDI + 0x7a) & 1) != 0) || ((*(byte *)(in_RDI + 0x7b) & 1) != 0)) {
    if ((*(byte *)(in_RDI + 0x7a) & 1) != 0) {
      local_10 = core::array<irr::video::ITexture_*>::size
                           ((array<irr::video::ITexture_*> *)0x347d9e);
      local_14 = core::array<unsigned_int>::size((array<unsigned_int> *)0x347db3);
      puVar5 = core::min_<unsigned_int>(&local_10,&local_14);
      local_c = *puVar5;
      for (local_18 = 0; local_18 < local_c; local_18 = local_18 + 1) {
        ppIVar6 = core::array<irr::video::ITexture_*>::operator[]
                            ((array<irr::video::ITexture_*> *)in_stack_ffffffffffffff70,
                             in_stack_ffffffffffffff6c);
        local_20 = (COpenGLCoreTexture<irr::video::COpenGLDriver> *)*ppIVar6;
        if (local_20 == (COpenGLCoreTexture<irr::video::COpenGLDriver> *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = COpenGLCoreTexture<irr::video::COpenGLDriver>::getOpenGLTextureName(local_20);
        }
        local_24 = local_4c;
        if (local_4c == 0) {
          puVar5 = core::array<unsigned_int>::operator[]
                             ((array<unsigned_int> *)in_stack_ffffffffffffff70,
                              in_stack_ffffffffffffff6c);
          if (*puVar5 != 0) {
            puVar5 = core::array<unsigned_int>::operator[]
                               ((array<unsigned_int> *)in_stack_ffffffffffffff70,
                                in_stack_ffffffffffffff6c);
            *puVar5 = 0;
            core::array<unsigned_int>::operator[]
                      ((array<unsigned_int> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
            COpenGLExtensionHandler::irrGlFramebufferTexture2D
                      ((COpenGLExtensionHandler *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (GLenum)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                       (GLenum)in_stack_ffffffffffffff78,
                       (GLenum)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                       (GLuint)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
            os::Printer::log((Printer *)"Error: Could not set render target.",__x);
          }
        }
        else {
          uVar2 = local_18 + 0x8ce0;
          puVar5 = core::array<unsigned_int>::operator[]
                             ((array<unsigned_int> *)in_stack_ffffffffffffff70,
                              in_stack_ffffffffffffff6c);
          *puVar5 = uVar2;
          EVar3 = ITexture::getType(&local_20->super_ITexture);
          if (EVar3 == ETT_2D) {
            local_54 = 0xde1;
          }
          else {
            pEVar7 = core::array<irr::video::E_CUBE_SURFACE>::operator[]
                               ((array<irr::video::E_CUBE_SURFACE> *)in_stack_ffffffffffffff70,
                                in_stack_ffffffffffffff6c);
            local_54 = *pEVar7 + 0x8515;
          }
          local_28 = local_54;
          core::array<unsigned_int>::operator[]
                    ((array<unsigned_int> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          COpenGLExtensionHandler::irrGlFramebufferTexture2D
                    ((COpenGLExtensionHandler *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (GLenum)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (GLenum)in_stack_ffffffffffffff78,
                     (GLenum)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                     (GLuint)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        }
      }
      for (local_2c = local_c; uVar2 = local_2c,
          uVar4 = core::array<unsigned_int>::size((array<unsigned_int> *)0x347fc1), uVar2 < uVar4;
          local_2c = local_2c + 1) {
        puVar5 = core::array<unsigned_int>::operator[]
                           ((array<unsigned_int> *)in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff6c);
        if (*puVar5 != 0) {
          core::array<unsigned_int>::operator[]
                    ((array<unsigned_int> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          COpenGLExtensionHandler::irrGlFramebufferTexture2D
                    ((COpenGLExtensionHandler *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (GLenum)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (GLenum)in_stack_ffffffffffffff78,
                     (GLenum)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                     (GLuint)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          puVar5 = core::array<unsigned_int>::operator[]
                             ((array<unsigned_int> *)in_stack_ffffffffffffff70,
                              in_stack_ffffffffffffff6c);
          *puVar5 = 0;
        }
      }
      *(undefined1 *)(in_RDI + 0x7a) = 0;
    }
    if ((*(byte *)(in_RDI + 0x7b) & 1) != 0) {
      if (*(long *)(in_RDI + 0x28) == 0) {
        in_stack_ffffffffffffff84 = ECF_UNKNOWN;
      }
      else {
        in_stack_ffffffffffffff84 = ITexture::getColorFormat(*(ITexture **)(in_RDI + 0x28));
      }
      local_30 = in_stack_ffffffffffffff84;
      bVar1 = IImage::isDepthFormat(in_stack_ffffffffffffff84);
      if (bVar1) {
        local_34 = COpenGLCoreTexture<irr::video::COpenGLDriver>::getOpenGLTextureName
                             (*(COpenGLCoreTexture<irr::video::COpenGLDriver> **)(in_RDI + 0x28));
        COpenGLExtensionHandler::irrGlFramebufferTexture2D
                  ((COpenGLExtensionHandler *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (GLenum)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                   (GLenum)in_stack_ffffffffffffff78,
                   (GLenum)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                   (GLuint)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        textarget_00 = (GLenum)((ulong)in_stack_ffffffffffffff70 >> 0x20);
        target = (GLenum)((ulong)in_stack_ffffffffffffff78 >> 0x20);
        if (local_30 == ECF_D24S8) {
          COpenGLExtensionHandler::irrGlFramebufferTexture2D
                    ((COpenGLExtensionHandler *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),target,
                     (GLenum)in_stack_ffffffffffffff78,textarget_00,
                     (GLuint)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          *(undefined1 *)(in_RDI + 0x79) = 1;
        }
        else {
          if ((*(byte *)(in_RDI + 0x79) & 1) != 0) {
            COpenGLExtensionHandler::irrGlFramebufferTexture2D
                      ((COpenGLExtensionHandler *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),target,
                       (GLenum)in_stack_ffffffffffffff78,textarget_00,
                       (GLuint)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          }
          *(undefined1 *)(in_RDI + 0x79) = 0;
        }
        *(undefined1 *)(in_RDI + 0x78) = 1;
      }
      else {
        if ((*(byte *)(in_RDI + 0x78) & 1) != 0) {
          COpenGLExtensionHandler::irrGlFramebufferTexture2D
                    ((COpenGLExtensionHandler *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (GLenum)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (GLenum)in_stack_ffffffffffffff78,
                     (GLenum)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                     (GLuint)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        }
        if ((*(byte *)(in_RDI + 0x79) & 1) != 0) {
          COpenGLExtensionHandler::irrGlFramebufferTexture2D
                    ((COpenGLExtensionHandler *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (GLenum)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (GLenum)in_stack_ffffffffffffff78,
                     (GLenum)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                     (GLuint)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        }
        *(undefined1 *)(in_RDI + 0x78) = 0;
        *(undefined1 *)(in_RDI + 0x79) = 0;
      }
      *(undefined1 *)(in_RDI + 0x7b) = 0;
    }
    if ((*(int *)(in_RDI + 0x88) != 0) && (*(int *)(in_RDI + 0x7c) != 0)) {
      local_38 = core::array<irr::video::ITexture_*>::size
                           ((array<irr::video::ITexture_*> *)0x348232);
      if (local_38 == 0) {
        COpenGLExtensionHandler::irrGlDrawBuffer
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      }
      else if ((local_38 == 1) || (*(int *)(in_RDI + 0x8c) == 0)) {
        COpenGLExtensionHandler::irrGlDrawBuffer
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      }
      else {
        this_00 = (array<unsigned_int> *)(in_RDI + 0x8c);
        local_40 = core::array<unsigned_int>::size((array<unsigned_int> *)0x3482ac);
        puVar5 = core::min_<unsigned_int>(&local_38,&local_40);
        puVar5 = core::min_<unsigned_int>((uint *)this_00,puVar5);
        uVar2 = *puVar5;
        n = (GLsizei)((ulong)(*(long *)(in_RDI + 0x90) + 0x498) >> 0x20);
        local_3c = uVar2;
        core::array<unsigned_int>::pointer(this_00);
        COpenGLExtensionHandler::irrGlDrawBuffers
                  ((COpenGLExtensionHandler *)CONCAT44(in_stack_ffffffffffffff84,uVar2),n,
                   (GLenum *)this_00);
      }
    }
  }
  return;
}

Assistant:

void update()
	{
		if (RequestTextureUpdate || RequestDepthStencilUpdate) {
			// Set color attachments.

			if (RequestTextureUpdate) {
				// Set new color textures.

				const u32 textureSize = core::min_(Textures.size(), AssignedTextures.size());

				for (u32 i = 0; i < textureSize; ++i) {
					TOpenGLTexture *currentTexture = static_cast<TOpenGLTexture *>(Textures[i]);
					GLuint textureID = currentTexture ? currentTexture->getOpenGLTextureName() : 0;

					if (textureID != 0) {
						AssignedTextures[i] = GL_COLOR_ATTACHMENT0 + i;
						GLenum textarget = currentTexture->getType() == ETT_2D ? GL_TEXTURE_2D : GL_TEXTURE_CUBE_MAP_POSITIVE_X + (int)CubeSurfaces[i];
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], textarget, textureID, 0);
#ifdef _DEBUG
						Driver->testGLError(__LINE__);
#endif
					} else if (AssignedTextures[i] != GL_NONE) {
						AssignedTextures[i] = GL_NONE;
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], GL_TEXTURE_2D, 0, 0);

						os::Printer::log("Error: Could not set render target.", ELL_ERROR);
					}
				}

				// Reset other render target channels.

				for (u32 i = textureSize; i < AssignedTextures.size(); ++i) {
					if (AssignedTextures[i] != GL_NONE) {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], GL_TEXTURE_2D, 0, 0);
						AssignedTextures[i] = GL_NONE;
					}
				}

				RequestTextureUpdate = false;
			}

			// Set depth and stencil attachments.

			if (RequestDepthStencilUpdate) {
				const ECOLOR_FORMAT textureFormat = (DepthStencil) ? DepthStencil->getColorFormat() : ECF_UNKNOWN;

				if (IImage::isDepthFormat(textureFormat)) {
					GLuint textureID = static_cast<TOpenGLTexture *>(DepthStencil)->getOpenGLTextureName();

#ifdef _IRR_EMSCRIPTEN_PLATFORM_ // The WEBGL_depth_texture extension does not allow attaching stencil+depth separate.
					if (textureFormat == ECF_D24S8) {
						GLenum attachment = 0x821A; // GL_DEPTH_STENCIL_ATTACHMENT
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, attachment, GL_TEXTURE_2D, textureID, 0);
						AssignedStencil = true;
					} else {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);
						AssignedStencil = false;
					}
#else
					Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);

					if (textureFormat == ECF_D24S8) {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);

						AssignedStencil = true;
					} else {
						if (AssignedStencil)
							Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

						AssignedStencil = false;
					}
#endif
					AssignedDepth = true;
				} else {
					if (AssignedDepth)
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

					if (AssignedStencil)
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

					AssignedDepth = false;
					AssignedStencil = false;
				}
#ifdef _DEBUG
				Driver->testGLError(__LINE__);
#endif

				RequestDepthStencilUpdate = false;
			}

			// Configure drawing operation.

			if (ColorAttachment > 0 && BufferID != 0) {
				const u32 textureSize = Textures.size();

				if (textureSize == 0)
					Driver->irrGlDrawBuffer(GL_NONE);
				else if (textureSize == 1 || MultipleRenderTarget == 0)
					Driver->irrGlDrawBuffer(GL_COLOR_ATTACHMENT0);
				else {
					const u32 bufferCount = core::min_(MultipleRenderTarget, core::min_(textureSize, AssignedTextures.size()));

					Driver->irrGlDrawBuffers(bufferCount, AssignedTextures.pointer());
				}

#ifdef _DEBUG
				Driver->testGLError(__LINE__);
#endif
			}

#ifdef _DEBUG
			checkFBO(Driver);
#endif
		}
	}